

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::RRSFCProcessorMap(DistributionMapping *this,BoxArray *boxes,int nprocs)

{
  Ref *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  int in_stack_000000d4;
  BoxArray *in_stack_000000d8;
  DistributionMapping *in_stack_000000e0;
  Ref *__new_size;
  
  __new_size = in_RDI;
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x11f2051);
  Ref::clear(in_RDI);
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x11f2063);
  BoxArray::size((BoxArray *)0x11f2071);
  std::vector<int,_std::allocator<int>_>::resize(unaff_retaddr,(size_type)__new_size);
  RRSFCDoIt(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
  return;
}

Assistant:

void
DistributionMapping::RRSFCProcessorMap (const BoxArray&          boxes,
                                        int                      nprocs)
{
    BL_ASSERT(boxes.size() > 0);

    m_ref->clear();
    m_ref->m_pmap.resize(boxes.size());

    RRSFCDoIt(boxes,nprocs);
}